

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshifter.cpp
# Opt level: O3

void anon_unknown.dwarf_174c0a::Fshifter_getParami(EffectProps *props,ALenum param,int *val)

{
  long lVar1;
  effect_exception *this;
  
  lVar1 = 4;
  if (param != 2) {
    if (param != 3) {
      this = (effect_exception *)__cxa_allocate_exception(0x30);
      effect_exception::effect_exception
                (this,0xa002,"Invalid frequency shifter integer property 0x%04x",(ulong)(uint)param)
      ;
      __cxa_throw(this,&effect_exception::typeinfo,al::base_exception::~base_exception);
    }
    lVar1 = 8;
  }
  *val = *(int *)((long)props + lVar1);
  return;
}

Assistant:

void Fshifter_getParami(const EffectProps *props, ALenum param, int *val)
{
    switch(param)
    {
    case AL_FREQUENCY_SHIFTER_LEFT_DIRECTION:
        *val = props->Fshifter.LeftDirection;
        break;
    case AL_FREQUENCY_SHIFTER_RIGHT_DIRECTION:
        *val = props->Fshifter.RightDirection;
        break;
    default:
        throw effect_exception{AL_INVALID_ENUM,
            "Invalid frequency shifter integer property 0x%04x", param};
    }
}